

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O1

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::line
          (rasterizer_cells_aa<agg::cell_aa> *this,int x1,int y1,int x2,int y2)

{
  cell_type *pcVar1;
  int *piVar2;
  cell_type *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint y1_00;
  int iVar17;
  int iVar18;
  int iVar19;
  int ex;
  
  lVar10 = (long)x2 - (long)x1;
  if (lVar10 - 0x400000U < 0xffffffffff800001) {
    iVar19 = (int)((ulong)((long)x2 + (long)x1) >> 1);
    iVar11 = (int)((ulong)((long)y2 + (long)y1) >> 1);
    line(this,x1,y1,iVar19,iVar11);
    line(this,iVar19,iVar11,x2,y2);
  }
  iVar11 = x1 >> 8;
  if (iVar11 < this->m_min_x) {
    this->m_min_x = iVar11;
  }
  iVar19 = y1 >> 8;
  if (this->m_max_x < iVar11) {
    this->m_max_x = iVar11;
  }
  if (iVar19 < this->m_min_y) {
    this->m_min_y = iVar19;
  }
  iVar7 = x2 >> 8;
  if (this->m_max_y < iVar19) {
    this->m_max_y = iVar19;
  }
  if (iVar7 < this->m_min_x) {
    this->m_min_x = iVar7;
  }
  iVar17 = y2 >> 8;
  if (this->m_max_x < iVar7) {
    this->m_max_x = iVar7;
  }
  if (iVar17 < this->m_min_y) {
    this->m_min_y = iVar17;
  }
  if (this->m_max_y < iVar17) {
    this->m_max_y = iVar17;
  }
  pcVar1 = &this->m_curr_cell;
  if (((this->m_curr_cell).x != iVar11) || ((this->m_curr_cell).y != iVar19)) {
    if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
      if ((this->m_num_cells & 0xfff) == 0) {
        if (0x3ff < this->m_num_blocks) goto LAB_001107c7;
        allocate_block(this);
      }
      pcVar3 = this->m_curr_cell_ptr;
      this->m_curr_cell_ptr = pcVar3 + 1;
      iVar7 = pcVar1->y;
      iVar8 = (this->m_curr_cell).cover;
      iVar13 = (this->m_curr_cell).area;
      pcVar3->x = pcVar1->x;
      pcVar3->y = iVar7;
      pcVar3->cover = iVar8;
      pcVar3->area = iVar13;
      this->m_num_cells = this->m_num_cells + 1;
    }
LAB_001107c7:
    (this->m_curr_cell).x = iVar11;
    (this->m_curr_cell).y = iVar19;
    (this->m_curr_cell).cover = 0;
    (this->m_curr_cell).area = 0;
  }
  y1_00 = y1 & 0xff;
  if (iVar19 == iVar17) goto LAB_00110bbc;
  lVar16 = (long)y2 - (long)y1;
  if (x2 != x1) {
    if (lVar16 < 0) {
      lVar16 = -lVar16;
      iVar7 = -1;
      iVar11 = 0;
      uVar15 = y1_00;
    }
    else {
      iVar11 = 0x100;
      iVar7 = 1;
      uVar15 = 0x100 - y1_00;
    }
    iVar12 = (int)((long)((ulong)uVar15 * lVar10) % lVar16);
    iVar8 = (iVar12 >> 0x1f) + x1 + (int)((long)((ulong)uVar15 * lVar10) / lVar16);
    render_hline(this,iVar19,x1,y1_00,iVar8,iVar11);
    iVar13 = iVar7 + iVar19;
    if (((this->m_curr_cell).y != iVar13) || ((this->m_curr_cell).x != iVar8 >> 8)) {
      if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
        if ((this->m_num_cells & 0xfff) == 0) {
          if (0x3ff < this->m_num_blocks) goto LAB_00110a6b;
          allocate_block(this);
        }
        pcVar3 = this->m_curr_cell_ptr;
        this->m_curr_cell_ptr = pcVar3 + 1;
        iVar18 = pcVar1->y;
        iVar4 = (this->m_curr_cell).cover;
        iVar14 = (this->m_curr_cell).area;
        pcVar3->x = pcVar1->x;
        pcVar3->y = iVar18;
        pcVar3->cover = iVar4;
        pcVar3->area = iVar14;
        this->m_num_cells = this->m_num_cells + 1;
      }
LAB_00110a6b:
      (this->m_curr_cell).x = iVar8 >> 8;
      (this->m_curr_cell).y = iVar13;
      (this->m_curr_cell).cover = 0;
      (this->m_curr_cell).area = 0;
    }
    x1 = iVar8;
    if (iVar13 != iVar17) {
      iVar18 = (int)((lVar10 * 0x100) % lVar16);
      iVar4 = (int)lVar16;
      iVar14 = iVar18 + iVar4;
      if (-1 < iVar18) {
        iVar14 = iVar18;
      }
      iVar9 = iVar4;
      if (iVar12 < 0) {
        iVar9 = 0;
      }
      iVar12 = iVar12 - iVar9;
      iVar19 = iVar19 + iVar7 * 2;
      do {
        iVar12 = iVar12 + iVar14;
        iVar9 = iVar4;
        if (-1 >= iVar12) {
          iVar9 = 0;
        }
        x1 = (uint)(-1 < iVar12) + (iVar18 >> 0x1f) + (int)((lVar10 * 0x100) / lVar16) + iVar8;
        render_hline(this,iVar13,iVar8,0x100 - iVar11,x1,iVar11);
        if (((this->m_curr_cell).x != x1 >> 8) || (iVar19 != (this->m_curr_cell).y)) {
          if ((this->m_curr_cell).cover != 0 || (this->m_curr_cell).area != 0) {
            if ((this->m_num_cells & 0xfff) == 0) {
              if (0x3ff < this->m_num_blocks) goto LAB_00110b74;
              allocate_block(this);
            }
            pcVar3 = this->m_curr_cell_ptr;
            this->m_curr_cell_ptr = pcVar3 + 1;
            iVar8 = pcVar1->y;
            iVar5 = (this->m_curr_cell).cover;
            iVar6 = (this->m_curr_cell).area;
            pcVar3->x = pcVar1->x;
            pcVar3->y = iVar8;
            pcVar3->cover = iVar5;
            pcVar3->area = iVar6;
            this->m_num_cells = this->m_num_cells + 1;
          }
LAB_00110b74:
          (this->m_curr_cell).x = x1 >> 8;
          (this->m_curr_cell).y = iVar19;
          (this->m_curr_cell).cover = 0;
          (this->m_curr_cell).area = 0;
        }
        iVar12 = iVar12 - iVar9;
        iVar13 = iVar13 + iVar7;
        iVar19 = iVar19 + iVar7;
        iVar8 = x1;
      } while (iVar17 != iVar13);
    }
    iVar19 = iVar13;
    y1_00 = 0x100 - iVar11;
LAB_00110bbc:
    render_hline(this,iVar19,x1,y1_00,x2,y2 & 0xff);
    return;
  }
  iVar7 = (x1 & 0xffU) * 2;
  iVar12 = (uint)(-1 < lVar16) * 0x100;
  uVar15 = (uint)(lVar16 >> 0x3f) | 1;
  iVar8 = iVar12 - y1_00;
  iVar13 = (this->m_curr_cell).cover + iVar8;
  (this->m_curr_cell).cover = iVar13;
  iVar8 = iVar8 * iVar7 + (this->m_curr_cell).area;
  (this->m_curr_cell).area = iVar8;
  iVar18 = uVar15 + iVar19;
  if (((this->m_curr_cell).x == iVar11) && ((this->m_curr_cell).y == iVar18)) goto LAB_001108b7;
  if (iVar8 != 0 || iVar13 != 0) {
    if ((this->m_num_cells & 0xfff) == 0) {
      if (0x3ff < this->m_num_blocks) goto LAB_001108a8;
      allocate_block(this);
    }
    pcVar3 = this->m_curr_cell_ptr;
    this->m_curr_cell_ptr = pcVar3 + 1;
    iVar8 = pcVar1->y;
    iVar13 = (this->m_curr_cell).cover;
    iVar4 = (this->m_curr_cell).area;
    pcVar3->x = pcVar1->x;
    pcVar3->y = iVar8;
    pcVar3->cover = iVar13;
    pcVar3->area = iVar4;
    this->m_num_cells = this->m_num_cells + 1;
  }
LAB_001108a8:
  (this->m_curr_cell).x = iVar11;
  (this->m_curr_cell).y = iVar18;
  (this->m_curr_cell).cover = 0;
  (this->m_curr_cell).area = 0;
LAB_001108b7:
  if (iVar18 != iVar17) {
    iVar8 = (uint)(-1 < lVar16) * 0x200 + -0x100;
    do {
      (this->m_curr_cell).cover = iVar8;
      (this->m_curr_cell).area = iVar8 * iVar7;
      iVar13 = uVar15 * 2 + iVar19;
      if (((this->m_curr_cell).x != iVar11) || (iVar13 != (this->m_curr_cell).y)) {
        if ((this->m_num_cells & 0xfff) == 0) {
          if (this->m_num_blocks < 0x400) {
            allocate_block(this);
            goto LAB_00110935;
          }
        }
        else {
LAB_00110935:
          pcVar3 = this->m_curr_cell_ptr;
          this->m_curr_cell_ptr = pcVar3 + 1;
          iVar18 = pcVar1->y;
          iVar4 = (this->m_curr_cell).cover;
          iVar14 = (this->m_curr_cell).area;
          pcVar3->x = pcVar1->x;
          pcVar3->y = iVar18;
          pcVar3->cover = iVar4;
          pcVar3->area = iVar14;
          this->m_num_cells = this->m_num_cells + 1;
        }
        (this->m_curr_cell).x = iVar11;
        (this->m_curr_cell).y = iVar13;
        (this->m_curr_cell).cover = 0;
        (this->m_curr_cell).area = 0;
      }
      iVar19 = iVar19 + uVar15;
    } while (iVar17 - uVar15 != iVar19);
  }
  iVar12 = iVar12 + (y2 | 0xffffff00U);
  piVar2 = &(this->m_curr_cell).cover;
  *piVar2 = *piVar2 + iVar12;
  piVar2 = &(this->m_curr_cell).area;
  *piVar2 = *piVar2 + iVar12 * iVar7;
  return;
}

Assistant:

void rasterizer_cells_aa<Cell>::line(int x1, int y1, int x2, int y2)
    {
        enum dx_limit_e { dx_limit = 16384 << poly_subpixel_shift };

        long long dx = (long long)x2 - (long long)x1;

        if(dx >= dx_limit || dx <= -dx_limit)
        {
            int cx = (int)(((long long)x1 + (long long)x2) >> 1);
            int cy = (int)(((long long)y1 + (long long)y2) >> 1);
            line(x1, y1, cx, cy);
            line(cx, cy, x2, y2);
        }

        long long dy = (long long)y2 - (long long)y1;
        int ex1 = x1 >> poly_subpixel_shift;
        int ex2 = x2 >> poly_subpixel_shift;
        int ey1 = y1 >> poly_subpixel_shift;
        int ey2 = y2 >> poly_subpixel_shift;
        int fy1 = y1 & poly_subpixel_mask;
        int fy2 = y2 & poly_subpixel_mask;

        int x_from, x_to;
        int rem, mod, lift, delta, first, incr;
        long long p;

        if(ex1 < m_min_x) m_min_x = ex1;
        if(ex1 > m_max_x) m_max_x = ex1;
        if(ey1 < m_min_y) m_min_y = ey1;
        if(ey1 > m_max_y) m_max_y = ey1;
        if(ex2 < m_min_x) m_min_x = ex2;
        if(ex2 > m_max_x) m_max_x = ex2;
        if(ey2 < m_min_y) m_min_y = ey2;
        if(ey2 > m_max_y) m_max_y = ey2;

        set_curr_cell(ex1, ey1);

        //everything is on a single hline
        if(ey1 == ey2)
        {
            render_hline(ey1, x1, fy1, x2, fy2);
            return;
        }

        //Vertical line - we have to calculate start and end cells,
        //and then - the common values of the area and coverage for
        //all cells of the line. We know exactly there's only one 
        //cell, so, we don't have to call render_hline().
        incr  = 1;
        if(dx == 0)
        {
            int ex = x1 >> poly_subpixel_shift;
            int two_fx = (x1 - (ex << poly_subpixel_shift)) << 1;
            int area;

            first = poly_subpixel_scale;
            if(dy < 0)
            {
                first = 0;
                incr  = -1;
            }

            x_from = x1;

            //render_hline(ey1, x_from, fy1, x_from, first);
            delta = first - fy1;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;

            ey1 += incr;
            set_curr_cell(ex, ey1);

            delta = first + first - poly_subpixel_scale;
            area = two_fx * delta;
            while(ey1 != ey2)
            {
                //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, first);
                m_curr_cell.cover = delta;
                m_curr_cell.area  = area;
                ey1 += incr;
                set_curr_cell(ex, ey1);
            }
            //render_hline(ey1, x_from, poly_subpixel_scale - first, x_from, fy2);
            delta = fy2 - poly_subpixel_scale + first;
            m_curr_cell.cover += delta;
            m_curr_cell.area  += two_fx * delta;
            return;
        }

        //ok, we have to render several hlines
        p     = (poly_subpixel_scale - fy1) * dx;
        first = poly_subpixel_scale;

        if(dy < 0)
        {
            p     = fy1 * dx;
            first = 0;
            incr  = -1;
            dy    = -dy;
        }

        delta = (int)(p / dy);
        mod   = (int)(p % dy);

        if(mod < 0)
        {
            delta--;
            mod += dy;
        }

        x_from = x1 + delta;
        render_hline(ey1, x1, fy1, x_from, first);

        ey1 += incr;
        set_curr_cell(x_from >> poly_subpixel_shift, ey1);

        if(ey1 != ey2)
        {
            p     = poly_subpixel_scale * dx;
            lift  = (int)(p / dy);
            rem   = (int)(p % dy);

            if(rem < 0)
            {
                lift--;
                rem += dy;
            }
            mod -= dy;

            while(ey1 != ey2)
            {
                delta = lift;
                mod  += rem;
                if (mod >= 0)
                {
                    mod -= dy;
                    delta++;
                }

                x_to = x_from + delta;
                render_hline(ey1, x_from, poly_subpixel_scale - first, x_to, first);
                x_from = x_to;

                ey1 += incr;
                set_curr_cell(x_from >> poly_subpixel_shift, ey1);
            }
        }
        render_hline(ey1, x_from, poly_subpixel_scale - first, x2, fy2);
    }